

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

IfStatement * __thiscall Parser::ifStmt(Parser *this)

{
  bool bVar1;
  ExprNode *pEVar2;
  Statements *pSVar3;
  IfStatement *pIVar4;
  undefined8 extraout_RAX;
  Token *this_00;
  Parser *unaff_R12;
  allocator<char> local_2a9;
  IfStatement *local_2a8;
  IfStatement *local_2a0;
  vector<std::pair<ExprNode_*,_Statements_*>,_std::allocator<std::pair<ExprNode_*,_Statements_*>_>_>
  totalTestSuites;
  Token boolKeyword;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  Token local_110;
  Token colon;
  
  totalTestSuites.
  super__Vector_base<std::pair<ExprNode_*,_Statements_*>,_std::allocator<std::pair<ExprNode_*,_Statements_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  totalTestSuites.
  super__Vector_base<std::pair<ExprNode_*,_Statements_*>,_std::allocator<std::pair<ExprNode_*,_Statements_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  totalTestSuites.
  super__Vector_base<std::pair<ExprNode_*,_Statements_*>,_std::allocator<std::pair<ExprNode_*,_Statements_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Tokenizer::getToken(&boolKeyword,this->tokenizer);
  bVar1 = Token::isIf(&boolKeyword);
  this_00 = (Token *)this;
  if (bVar1) {
    pEVar2 = exprOrTest(this);
    Tokenizer::getToken(&colon,this->tokenizer);
    if (colon._symbol == ':') {
      pSVar3 = suite(this);
      local_2a8 = (IfStatement *)operator_new(0x78);
      IfStatement::IfStatement(local_2a8,pEVar2,pSVar3);
      Tokenizer::getToken(&local_110,this->tokenizer);
      this_00 = &boolKeyword;
      Token::operator=(this_00,&local_110);
      Token::~Token(&local_110);
      local_2a0 = local_2a8;
      while( true ) {
        bVar1 = Token::isElif(this_00);
        if (!bVar1) break;
        pEVar2 = exprOrTest(this);
        Tokenizer::getToken(&local_110,this->tokenizer);
        Token::operator=(this_00,&local_110);
        Token::~Token(&local_110);
        if (boolKeyword._symbol != ':') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,"Parser::ifStmt",(allocator<char> *)&local_110);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,"Expected a colon, instead got",&local_2a9);
          die(this,&local_1b0,&local_1d0,&boolKeyword);
          unaff_R12 = this;
          goto LAB_00106c9f;
        }
        pSVar3 = suite(this);
        pIVar4 = (IfStatement *)operator_new(0x78);
        IfStatement::IfStatement(pIVar4,pEVar2,pSVar3);
        IfStatement::setElif(local_2a0,pIVar4);
        Tokenizer::getToken(&local_110,this->tokenizer);
        Token::operator=(this_00,&local_110);
        Token::~Token(&local_110);
        local_2a0 = pIVar4;
      }
      bVar1 = Token::isElse(&boolKeyword);
      if (!bVar1) {
        Tokenizer::ungetToken(this->tokenizer);
LAB_00106c15:
        Token::~Token(&colon);
        Token::~Token(&boolKeyword);
        std::
        _Vector_base<std::pair<ExprNode_*,_Statements_*>,_std::allocator<std::pair<ExprNode_*,_Statements_*>_>_>
        ::~_Vector_base(&totalTestSuites.
                         super__Vector_base<std::pair<ExprNode_*,_Statements_*>,_std::allocator<std::pair<ExprNode_*,_Statements_*>_>_>
                       );
        return local_2a8;
      }
      Tokenizer::getToken(&local_110,this->tokenizer);
      Token::operator=(&boolKeyword,&local_110);
      Token::~Token(&local_110);
      if (boolKeyword._symbol == ':') {
        pSVar3 = suite(this);
        pIVar4 = (IfStatement *)operator_new(0x78);
        IfStatement::IfStatement(pIVar4,(ExprNode *)0x0,pSVar3);
        IfStatement::setElif(local_2a0,pIVar4);
        goto LAB_00106c15;
      }
      goto LAB_00106d49;
    }
  }
  else {
LAB_00106c9f:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"Parser::ifStmt",(allocator<char> *)&colon);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"Expected an \'if\' token, instead got",
               (allocator<char> *)&local_110);
    die((Parser *)this_00,&local_130,&local_150,&boolKeyword);
  }
  this = unaff_R12;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"Parser::ifStmt",(allocator<char> *)&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"Expected a colon, instead got",&local_2a9);
  die((Parser *)this_00,&local_170,&local_190,&colon);
LAB_00106d49:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"Parser::ifStmt",(allocator<char> *)&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"Expected a colon, instead got",&local_2a9);
  die(this,&local_1f0,&local_210,&boolKeyword);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  Token::~Token(&colon);
  Token::~Token(&boolKeyword);
  std::
  _Vector_base<std::pair<ExprNode_*,_Statements_*>,_std::allocator<std::pair<ExprNode_*,_Statements_*>_>_>
  ::~_Vector_base(&totalTestSuites.
                   super__Vector_base<std::pair<ExprNode_*,_Statements_*>,_std::allocator<std::pair<ExprNode_*,_Statements_*>_>_>
                 );
  _Unwind_Resume(extraout_RAX);
}

Assistant:

IfStatement *Parser::ifStmt() {
    std::vector<std::pair<ExprNode*, Statements*>>totalTestSuites;
    Token boolKeyword = tokenizer.getToken();
    if (!boolKeyword.isIf())
        die("Parser::ifStmt", "Expected an 'if' token, instead got", boolKeyword);
    ExprNode *ifConditionTest = test();

    Token colon = tokenizer.getToken();
    if(!colon.isColon())
        die("Parser::ifStmt", "Expected a colon, instead got", colon);
    Statements* stmts = suite();

    auto *ifStmt = new IfStatement(ifConditionTest, stmts);
    boolKeyword = tokenizer.getToken();
    IfStatement* prevIf = ifStmt;
    while (boolKeyword.isElif()) {
        ifConditionTest = test();
        boolKeyword = tokenizer.getToken();
        if (!boolKeyword.isColon())
            die("Parser::ifStmt", "Expected a colon, instead got", boolKeyword);
        stmts = suite();
        auto *elif = new IfStatement(ifConditionTest, stmts);
        prevIf->setElif(elif);
        prevIf = elif;
        boolKeyword = tokenizer.getToken();
    }
    if(boolKeyword.isElse()){
        boolKeyword = tokenizer.getToken();
        if (!boolKeyword.isColon())
            die("Parser::ifStmt", "Expected a colon, instead got", boolKeyword);
        stmts = suite();
        auto *elseStmt = new IfStatement(nullptr, stmts);
        prevIf->setElif(elseStmt);
    } else
        tokenizer.ungetToken();
    return ifStmt;

}